

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantmatrix.cc
# Opt level: O1

void __thiscall fasttext::QuantMatrix::quantize(QuantMatrix *this,DenseMatrix *mat)

{
  real *x;
  int64_t m;
  Vector norms;
  Vector local_30;
  
  if (this->qnorm_ == true) {
    m = Matrix::size(&mat->super_Matrix,0);
    Vector::Vector(&local_30,m);
    DenseMatrix::l2NormRow(mat,&local_30);
    DenseMatrix::divideRow(mat,&local_30,0,-1);
    quantizeNorm(this,&local_30);
    if (local_30.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_30.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  x = (mat->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
      ._M_start;
  ProductQuantizer::train
            ((this->pq_)._M_t.
             super___uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
             ._M_t.
             super__Tuple_impl<0UL,_fasttext::ProductQuantizer_*,_std::default_delete<fasttext::ProductQuantizer>_>
             .super__Head_base<0UL,_fasttext::ProductQuantizer_*,_false>._M_head_impl,
             (int32_t)(this->super_Matrix).m_,x);
  ProductQuantizer::compute_codes
            ((this->pq_)._M_t.
             super___uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
             ._M_t.
             super__Tuple_impl<0UL,_fasttext::ProductQuantizer_*,_std::default_delete<fasttext::ProductQuantizer>_>
             .super__Head_base<0UL,_fasttext::ProductQuantizer_*,_false>._M_head_impl,x,
             (this->codes_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start,(int32_t)(this->super_Matrix).m_);
  return;
}

Assistant:

void QuantMatrix::quantize(DenseMatrix&& mat) {
  if (qnorm_) {
    Vector norms(mat.size(0));
    mat.l2NormRow(norms);
    mat.divideRow(norms);
    quantizeNorm(norms);
  }
  auto dataptr = mat.data();
  pq_->train(m_, dataptr);
  pq_->compute_codes(dataptr, codes_.data(), m_);
}